

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges
               (uint unset_nbr1_index,uint count,ON_SubDVertex *v,ON_SubDEdgePtrLink *links)

{
  char cVar1;
  ON_SubDVertexTag OVar2;
  uint j_1;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ON_SubDEdge **ppOVar8;
  ON_2udex OVar9;
  uint uVar10;
  uint j;
  ulong uVar11;
  ulong *puVar12;
  ON_SubDEdge **ppOVar13;
  ON_SubDEdgePtrLink *pOVar14;
  long lVar15;
  ON_2udex OVar16;
  bool bVar17;
  uint local_d8 [4];
  ulong local_c8 [2];
  ulong local_b8 [2];
  ON_2udex local_a8 [5];
  ON_2udex pairs [2];
  uint crease_edge_link_index [4];
  uint smooth_edge_link_index [4];
  ON_SubDEdge *vertex_edges [4];
  ON_SubDEdge *link_edges [4];
  
  if ((v == (ON_SubDVertex *)0x0 || count < 3) || (v->m_edge_count != count)) {
    return;
  }
  OVar2 = v->m_vertex_tag;
  if (count == 4) {
    if (1 < (byte)(OVar2 - Smooth)) {
      return;
    }
  }
  else if (count == 3) {
    if ((OVar2 != Crease) && (OVar2 != Dart)) {
      return;
    }
  }
  else {
    bVar17 = OVar2 != Crease;
    OVar2 = Crease;
    if (bVar17) {
      return;
    }
  }
  pairs[1].i = 0;
  pairs[1].j = 0;
  crease_edge_link_index[0] = 0;
  crease_edge_link_index[1] = 0;
  local_a8[4].i = 0;
  local_a8[4].j = 0;
  pairs[0].i = 0;
  pairs[0].j = 0;
  local_a8[2].i = 0;
  local_a8[2].j = 0;
  local_a8[3].i = 0;
  local_a8[3].j = 0;
  local_a8[0].i = 0;
  local_a8[0].j = 0;
  local_a8[1].i = 0;
  local_a8[1].j = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  uVar11 = 0;
  uVar3 = 0;
  uVar7 = 0;
  pOVar14 = links;
  while( true ) {
    uVar6 = (uint)uVar3;
    uVar10 = (uint)uVar7;
    if (count == uVar11) break;
    OVar9 = (ON_2udex)((pOVar14->m_ep).m_ptr & 0xfffffffffffffff8);
    if (OVar9 == (ON_2udex)0x0) {
      return;
    }
    OVar16 = (ON_2udex)(v->m_edges[uVar11].m_ptr & 0xfffffffffffffff8);
    if (OVar16 == (ON_2udex)0x0) {
      return;
    }
    if (uVar11 < 4) {
      pairs[uVar11 - 1] = OVar9;
      local_a8[uVar11] = OVar16;
    }
    cVar1 = *(char *)((long)OVar9 + 0x60);
    if (cVar1 == '\x04') {
LAB_005f1d72:
      if (*(short *)((long)OVar9 + 100) != 2) {
        if (cVar1 != '\x02') {
          return;
        }
        goto LAB_005f1d96;
      }
      if (uVar6 < 4) {
        *(int *)((long)local_b8 + uVar3 * 4) = (int)uVar11;
      }
      uVar3 = (ulong)(uVar6 + 1);
    }
    else {
      if (cVar1 != '\x02') {
        if (cVar1 != '\x01') {
          return;
        }
        goto LAB_005f1d72;
      }
LAB_005f1d96:
      if (uVar10 < 4) {
        *(int *)((long)local_c8 + uVar7 * 4) = (int)uVar11;
      }
      uVar7 = (ulong)(uVar10 + 1);
    }
    uVar11 = uVar11 + 1;
    pOVar14 = pOVar14 + 1;
  }
  if (OVar2 == Crease && uVar10 == 2) {
    links[local_c8[0] & 0xffffffff].m_nbr_index = links[local_c8[0] >> 0x20].m_index;
    links[local_c8[0] >> 0x20].m_nbr_index = links[local_c8[0] & 0xffffffff].m_index;
    if (uVar6 != 1) goto LAB_005f1df6;
    puVar12 = local_b8;
  }
  else {
LAB_005f1df6:
    if (uVar6 != 2) goto LAB_005f1e40;
    links[local_b8[0] & 0xffffffff].m_nbr_index = links[local_b8[0] >> 0x20].m_index;
    links[local_b8[0] >> 0x20].m_nbr_index = links[local_b8[0] & 0xffffffff].m_index;
    if (uVar10 != 1) goto LAB_005f1e40;
    puVar12 = local_c8;
  }
  links[(uint)*puVar12].m_nbr_index = unset_nbr1_index;
LAB_005f1e40:
  if (((uVar6 == 4 && count == 4) && uVar10 == 0) && (OVar2 == Smooth && v->m_face_count == 4)) {
    uVar6 = 0;
    for (uVar3 = 0; (uVar3 == uVar6 && (uVar3 < 4)); uVar3 = uVar3 + 1) {
      lVar4 = 0;
      do {
        lVar5 = lVar4;
        if (lVar5 == 4) goto LAB_005f1e9e;
        lVar4 = lVar5 + 1;
      } while (local_a8[lVar5] != pairs[uVar3 - 1]);
      local_a8[lVar5].i = 0;
      local_a8[lVar5].j = 0;
      uVar6 = uVar6 + 1;
LAB_005f1e9e:
    }
    if (uVar6 == 4) {
      lVar4 = 0;
      do {
        if (lVar4 == 0x20) {
          lVar5 = -3;
          ppOVar8 = vertex_edges;
          uVar3 = 0;
          lVar4 = 0;
          do {
            if (lVar4 == 4) {
              if ((int)uVar3 != 2) {
                return;
              }
              links[local_d8[0]].m_nbr_index = links[local_d8[1]].m_index;
              links[local_d8[1]].m_nbr_index = links[local_d8[0]].m_index;
              links[local_d8[2]].m_nbr_index = links[local_d8[3]].m_index;
              links[local_d8[3]].m_nbr_index = links[local_d8[2]].m_index;
              return;
            }
            ppOVar13 = ppOVar8;
            for (lVar15 = lVar5; uVar6 = (uint)uVar3, lVar15 != 0; lVar15 = lVar15 + 1) {
              if (((*(ON_SubDEdge **)(crease_edge_link_index + lVar4 * 4 + 2) != ppOVar13[-1]) &&
                  (*(ON_SubDEdge **)(crease_edge_link_index + lVar4 * 4 + 2) != *ppOVar13)) &&
                 (*(ON_SubDEdge **)(smooth_edge_link_index + lVar4 * 4) != *ppOVar13 &&
                  *(ON_SubDEdge **)(smooth_edge_link_index + lVar4 * 4) != ppOVar13[-1])) {
                if (uVar6 < 2) {
                  local_d8[uVar3 * 2] = (uint)lVar4;
                  local_d8[uVar3 * 2 + 1] = (int)lVar15 + 4;
                  uVar3 = (ulong)(uVar6 + 1);
                }
                else {
                  uVar6 = uVar6 + 1;
                  uVar3 = 0;
                  if (2 < uVar6) break;
                }
              }
              ppOVar13 = ppOVar13 + 2;
            }
            lVar5 = lVar5 + 1;
            ppOVar8 = ppOVar8 + 2;
            uVar3 = (ulong)uVar6;
            lVar4 = lVar4 + 1;
          } while( true );
        }
        lVar5 = *(long *)((long)&pairs[-1].i + lVar4);
        uVar3 = *(ulong *)(lVar5 + 0x68);
        *(ulong *)((long)crease_edge_link_index + lVar4 * 2 + 8) = uVar3 & 0xfffffffffffffff8;
        uVar7 = *(ulong *)(lVar5 + 0x70) & 0xfffffffffffffff8;
        *(ulong *)((long)smooth_edge_link_index + lVar4 * 2) = uVar7;
      } while (((uVar3 & 0xfffffffffffffff8) != 0) && (lVar4 = lVar4 + 8, uVar7 != 0));
    }
  }
  return;
}

Assistant:

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
  const unsigned int unset_nbr1_index,
  unsigned int count,
  const ON_SubDVertex* v,
  ON_SubDEdgePtrLink* links
)
{
  // If the case can't be resolved by Resolve3OrMoreEdges(), 
  // then the vertex will not appear in the middle of a chain.

  if (count < 3 || nullptr == v || count != (unsigned int)v->m_edge_count)
    return;

  switch (count)
  {
  case 3:
    if (false == v->IsCrease() && false == v->IsDart())
      return;
    break;

  case 4:
    if (false == v->IsCrease() && false == v->IsSmooth())
      return;
    break;

  default:
    if (false == v->IsCrease())
      return;
    break;
  }

  const ON_SubDEdge* link_edges[4] = {};
  const ON_SubDEdge* vertex_edges[4] = {};
  unsigned int crease_edge_count = 0;
  unsigned int smooth_edge_count = 0;
  unsigned int smooth_edge_link_index[4] = {};
  unsigned int crease_edge_link_index[4] = {};
  for (unsigned int j = 0; j < count; j++)
  {
    const ON_SubDEdge* e = links[j].m_ep.Edge();
    if (nullptr == e)
      return;
    const ON_SubDEdge* ve = v->Edge(j);
    if (nullptr == ve)
      return;
    if (j < 4)
    {
      link_edges[j] = e;
      vertex_edges[j] = ve;
    }

    if (e->IsSmooth() && 2 == e->m_face_count)
    {
      if ( smooth_edge_count < 4)
        smooth_edge_link_index[smooth_edge_count] = j;
      ++smooth_edge_count;
    }
    else if (e->IsCrease())
    {
      if (crease_edge_count < 4)
        crease_edge_link_index[crease_edge_count] = j;
      ++crease_edge_count;
    }
    else
      return;
  }

  if ( 2 == crease_edge_count && v->IsCrease() )
  {
    // Link the two creased edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[crease_edge_link_index[0]].m_nbr_index = links[crease_edge_link_index[1]].m_index;
    links[crease_edge_link_index[1]].m_nbr_index = links[crease_edge_link_index[0]].m_index;
    if (1 == smooth_edge_count)
    {
      // this edge will be at the end of a chain.
      links[smooth_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
  }

  if (2 == smooth_edge_count)
  {
    // Link the two smooth edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[smooth_edge_link_index[0]].m_nbr_index = links[smooth_edge_link_index[1]].m_index;
    links[smooth_edge_link_index[1]].m_nbr_index = links[smooth_edge_link_index[0]].m_index;
    if (1 == crease_edge_count)
    {
      // this edge will be at the end of a chain
      links[crease_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
   }

  if (
    4 != count
    || 4 != smooth_edge_count
    || 0 != crease_edge_count
    || 4 != v->m_face_count
    || 4 != v->m_edge_count
    || false == v->IsSmooth()
    )
    return;

  // make sure vertex_edges[] and link_edges[] are the same list.
  unsigned int match_count = 0;
  for (unsigned int j = 0; j == match_count && j < count; j++)
  {
    for (unsigned int k = 0; k < count; k++)
    {
      if (vertex_edges[k] == link_edges[j])
      {
        vertex_edges[k] = nullptr;
        match_count++;
        break;
      }
    }
  }
  if (match_count != count)
    return;
  
  // vertex has 4 faces and 4 smooth edges. Link opposite edges.
  const ON_SubDFace* edge_faces[4][2];
  for (unsigned int j = 0; j < 4; j++)
  {
    edge_faces[j][0] = link_edges[j]->Face(0);
    edge_faces[j][1] = link_edges[j]->Face(1);
    if (nullptr == edge_faces[j][0] || nullptr == edge_faces[j][1])
      return;
  }
  ON_2udex pairs[2];
  unsigned int pair_count = 0;
  ON_2udex pair;
  for (pair.i = 0; pair.i < 4; ++pair.i) for (pair.j = pair.i+1; pair.j < 4; ++pair.j)
  {
    if (
      edge_faces[pair.i][0] != edge_faces[pair.j][0]
      && edge_faces[pair.i][0] != edge_faces[pair.j][1]
      && edge_faces[pair.i][1] != edge_faces[pair.j][0]
      && edge_faces[pair.i][1] != edge_faces[pair.j][1]
      )
    {
      // the associated edges share no faces.
      if ( pair_count < 2)
        pairs[pair_count] = pair;
      if (++pair_count > 2)
        break;
    }
  }
  if (2 == pair_count)
  {
    links[pairs[0].i].m_nbr_index = links[pairs[0].j].m_index;
    links[pairs[0].j].m_nbr_index = links[pairs[0].i].m_index;
    links[pairs[1].i].m_nbr_index = links[pairs[1].j].m_index;
    links[pairs[1].j].m_nbr_index = links[pairs[1].i].m_index;
  }

  return;
}